

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_locale.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  undefined8 uVar2;
  ulong uVar3;
  undefined8 uVar4;
  char *pcVar5;
  uint uVar6;
  ulong uVar7;
  char buf2 [10];
  char buf1 [10];
  
  setlocale(1,"de_DE");
  snprintf(buf1,10,"%f",0x3fb999999999999a);
  uVar2 = json_tokener_parse("[1.2,3.4,123456.78,5.0,2.3e10]");
  snprintf(buf2,10,"%f",0x3fb999999999999a);
  iVar1 = strcmp(buf1,buf2);
  if (iVar1 != 0) {
    printf("ERROR: Original locale not restored \"%s\" != \"%s\"",buf1,buf2);
  }
  setlocale(1,"C");
  uVar6 = 0;
  printf("new_obj.to_string()=[");
  while( true ) {
    uVar7 = (ulong)uVar6;
    uVar3 = json_object_array_length(uVar2);
    if (uVar3 <= uVar7) break;
    uVar4 = json_object_array_get_idx(uVar2,uVar7);
    pcVar5 = ",";
    if (uVar7 == 0) {
      pcVar5 = "";
    }
    json_object_get_double(uVar4);
    printf("%s%.2lf",pcVar5);
    uVar6 = uVar6 + 1;
  }
  puts("]");
  uVar4 = json_object_to_json_string_ext(uVar2,4);
  printf("new_obj.to_string()=%s\n",uVar4);
  json_object_put(uVar2);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
	json_object *new_obj;
#ifdef HAVE_SETLOCALE
	setlocale(LC_NUMERIC, "de_DE");
#endif

	char buf1[10], buf2[10];
	// Should result in "0,1", if the locale is installed.
	// Regardless of what it generates, we check that it's
	// consistent below.
	(void)snprintf(buf1, sizeof(buf1), "%f", 0.1);

	MC_SET_DEBUG(1);

	new_obj = json_tokener_parse("[1.2,3.4,123456.78,5.0,2.3e10]");

	(void)snprintf(buf2, sizeof(buf2), "%f", 0.1);
	if (strcmp(buf1, buf2) != 0)
		printf("ERROR: Original locale not restored \"%s\" != \"%s\"", buf1, buf2);

#ifdef HAVE_SETLOCALE
	setlocale(LC_NUMERIC, "C");
#endif

	// Explicitly print each value, to avoid having the "special"
	// serialization done for parsed doubles simply re-emit the original
	// string that was parsed.  (see json_object_new_double_s())
	printf("new_obj.to_string()=[");
	unsigned int ii;
	for (ii = 0; ii < json_object_array_length(new_obj); ii++)
	{
		json_object *val = json_object_array_get_idx(new_obj, ii);
		printf("%s%.2lf", (ii > 0) ? "," : "", json_object_get_double(val));
	}
	printf("]\n");

	printf("new_obj.to_string()=%s\n",
	       json_object_to_json_string_ext(new_obj, JSON_C_TO_STRING_NOZERO));
	json_object_put(new_obj);

	return 0;
}